

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5d835d::TemplateArgs::printLeft(TemplateArgs *this,OutputStream *S)

{
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '<';
  S->CurrentPosition = S->CurrentPosition + 1;
  NodeArray::printWithComma(&this->Params,S);
  if ((S->CurrentPosition != 0) && (S->Buffer[S->CurrentPosition - 1] == '>')) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ' ';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '>';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "<";
    Params.printWithComma(S);
    if (S.back() == '>')
      S += " ";
    S += ">";
  }